

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O3

void __thiscall film::film(film *this)

{
  undefined1 auVar1 [16];
  
  this->prev = (film *)0x0;
  this->x0 = 0.0;
  this->filmwidth = 0.0;
  this->gradwidth = 0.0;
  this->y0 = 0.0;
  this->y1 = 0.0;
  this->z0 = 0.0;
  this->z1 = 0.0;
  auVar1 = ZEXT416(0) << 0x40;
  this->ne = 0.0;
  this->mcr = 1.0;
  this->T = (double)auVar1._0_8_;
  this->vx = (double)auVar1._8_8_;
  *(undefined1 (*) [16])((long)&this->vx + 4) = auVar1;
  return;
}

Assistant:

film::film()
{
    prev = 0;
    x0 = 0;
    filmwidth = 0;
    gradwidth = 0;
    y0 = 0;
    y1 = 0;
    z0 = 0;
    z1 = 0;
    ne = 0;
    mcr = 1;
    T = 0;
    vx = 0;
    xnpic_film = 0;
    ynpic_film = 0;
    znpic_film = 0;
}